

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O2

Var Js::CrossSite::MarshalFrameDisplay(ScriptContext *scriptContext,FrameDisplay *display)

{
  ushort uVar1;
  RecyclableObject *value;
  bool bVar2;
  Recycler *alloc;
  FrameDisplay *this;
  void *pvVar3;
  UnscopablesWrapperObject *pUVar4;
  Var aRight;
  uint16 i;
  uint index;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  uVar1 = display->length;
  data.typeinfo = (type_info *)(ulong)((uint)uVar1 * 8);
  local_60 = (undefined1  [8])&FrameDisplay::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_286160c;
  data.filename._0_4_ = 0x7f;
  data._32_8_ = display;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  this = (FrameDisplay *)new<Memory::Recycler>(8,alloc,0x37ff80,0);
  this->tag = true;
  this->strictMode = false;
  this->length = uVar1;
  this->unused = 0;
  for (index = 0; uVar1 != index; index = index + 1) {
    pvVar3 = FrameDisplay::GetItem((FrameDisplay *)data._32_8_,index);
    bVar2 = VarIs<Js::UnscopablesWrapperObject>(pvVar3);
    if (bVar2) {
      pUVar4 = VarTo<Js::UnscopablesWrapperObject>(pvVar3);
      value = (pUVar4->wrappedObject).ptr;
      aRight = MarshalVar(scriptContext,value,
                          (((((value->type).ptr)->javascriptLibrary).ptr)->
                          super_JavascriptLibraryBase).scriptContext.ptr);
      pvVar3 = JavascriptOperators::ToUnscopablesWrapperObject(aRight,scriptContext);
    }
    else {
      pvVar3 = MarshalVar(scriptContext,pvVar3,false);
    }
    FrameDisplay::SetItem(this,index,pvVar3);
  }
  return this;
}

Assistant:

Var CrossSite::MarshalFrameDisplay(ScriptContext* scriptContext, FrameDisplay *display)
    {
        TTD_XSITE_LOG(scriptContext, "MarshalFrameDisplay", nullptr);

        uint16 length = display->GetLength();
        FrameDisplay *newDisplay =
            RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(Var), FrameDisplay, length);
        for (uint16 i = 0; i < length; i++)
        {
            Var value = display->GetItem(i);
            if (Js::VarIs<UnscopablesWrapperObject>(value))
            {
                // Here we are marshalling the wrappedObject and then ReWrapping th object in the new context.
                RecyclableObject* wrappedObject = Js::VarTo<UnscopablesWrapperObject>(value)->GetWrappedObject();
                ScriptContext* wrappedObjectScriptContext = wrappedObject->GetScriptContext();
                value = JavascriptOperators::ToUnscopablesWrapperObject(CrossSite::MarshalVar(scriptContext,
                  wrappedObject, wrappedObjectScriptContext), scriptContext);
            }
            else
            {
                value = CrossSite::MarshalVar(scriptContext, value);
            }
            newDisplay->SetItem(i, value);
        }

        return (Var)newDisplay;
    }